

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  TestCaseInfo *pTVar1;
  IRunContext *_runContext;
  IStreamingReporter *pIVar2;
  TestRunStats local_690;
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [32];
  TestCaseStats local_5b8;
  undefined1 local_428 [8];
  Totals deltaTotals;
  SectionStats testCaseSectionStats;
  Counts assertions;
  SectionInfo testCaseSection;
  undefined1 local_2c0 [8];
  ResultBuilder resultBuilder;
  string *message_local;
  RunContext *this_local;
  
  resultBuilder._672_8_ = message;
  makeUnexpectedResultBuilder((ResultBuilder *)local_2c0,this);
  ResultBuilder::setResultType((ResultBuilder *)local_2c0,FatalErrorCondition);
  ResultBuilder::operator<<
            ((ResultBuilder *)local_2c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             resultBuilder._672_8_);
  ResultBuilder::captureExpression((ResultBuilder *)local_2c0);
  handleUnfinishedSections(this);
  _runContext = C_A_T_C_H_Context();
  pTVar1 = this->m_activeTestCaseInfo;
  SectionInfo::SectionInfo
            ((SectionInfo *)&assertions.failedButOk,_runContext,&pTVar1->lineInfo,&pTVar1->name,
             &pTVar1->description);
  Counts::Counts((Counts *)&testCaseSectionStats.missingAssertions);
  assertions.passed = 1;
  SectionStats::SectionStats
            ((SectionStats *)&deltaTotals.testCases.failedButOk,
             (SectionInfo *)&assertions.failedButOk,
             (Counts *)&testCaseSectionStats.missingAssertions,0.0,false);
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])
            (pIVar2,&deltaTotals.testCases.failedButOk);
  Totals::Totals((Totals *)local_428);
  deltaTotals.testCases.passed = 1;
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  pTVar1 = this->m_activeTestCaseInfo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"",&local_601);
  TestCaseStats::TestCaseStats
            (&local_5b8,pTVar1,(Totals *)local_428,(string *)local_5d8,(string *)local_600,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_5b8);
  TestCaseStats::~TestCaseStats(&local_5b8);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  (this->m_totals).testCases.failed = (this->m_totals).testCases.failed + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"",&local_629);
  testGroupEnded(this,(string *)local_628,&this->m_totals,1,1);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  TestRunStats::TestRunStats(&local_690,&this->m_runInfo,&this->m_totals,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2,&local_690);
  TestRunStats::~TestRunStats(&local_690);
  SectionStats::~SectionStats((SectionStats *)&deltaTotals.testCases.failedButOk);
  SectionInfo::~SectionInfo((SectionInfo *)&assertions.failedButOk);
  ResultBuilder::~ResultBuilder((ResultBuilder *)local_2c0);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) CATCH_OVERRIDE {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            SectionInfo testCaseSection
                (   C_A_T_C_H_Context(),
                    m_activeTestCaseInfo->lineInfo,
                    m_activeTestCaseInfo->name,
                    m_activeTestCaseInfo->description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   *m_activeTestCaseInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }